

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

iterator __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,std::allocator<google::protobuf::FileDescriptor_const*>>
::find_soo<google::protobuf::FileDescriptor_const*>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,std::allocator<google::protobuf::FileDescriptor_const*>>
           *this,key_arg<const_google::protobuf::FileDescriptor_*> *key)

{
  bool bVar1;
  slot_type *slot;
  FileDescriptor **ts;
  iterator iVar2;
  EqualElement<const_google::protobuf::FileDescriptor_*> local_38;
  key_arg<const_google::protobuf::FileDescriptor_*> *local_28;
  key_arg<const_google::protobuf::FileDescriptor_*> *key_local;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *this_local;
  
  local_28 = key;
  key_local = (key_arg<const_google::protobuf::FileDescriptor_*> *)this;
  bVar1 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::is_soo((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    *)this);
  if (!bVar1) {
    __assert_fail("is_soo()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xda7,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, std::allocator<const google::protobuf::FileDescriptor *>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, Alloc = std::allocator<const google::protobuf::FileDescriptor *>, K = const google::protobuf::FileDescriptor *]"
                 );
  }
  bVar1 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::empty((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   *)this);
  if (!bVar1) {
    local_38.rhs = local_28;
    local_38.eq = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  ::eq_ref((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                            *)this);
    slot = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       *)this);
    ts = common_policy_traits<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,void>
         ::
         element<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>>
                   (slot);
    bVar1 = hash_policy_traits<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,void>
            ::
            apply<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,std::allocator<google::protobuf::FileDescriptor_const*>>::EqualElement<google::protobuf::FileDescriptor_const*>,google::protobuf::FileDescriptor_const*&,absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>>
                      (&local_38,ts);
    if (bVar1) {
      iVar2 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::soo_iterator((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                              *)this);
      return iVar2;
    }
  }
  iVar2 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::end((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 *)this);
  return iVar2;
}

Assistant:

iterator find_soo(const key_arg<K>& key) {
    assert(is_soo());
    return empty() || !PolicyTraits::apply(EqualElement<K>{key, eq_ref()},
                                           PolicyTraits::element(soo_slot()))
               ? end()
               : soo_iterator();
  }